

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O3

bool __thiscall
s2textformat::InternalMakePolygon
          (s2textformat *this,string_view str,S2Debug debug_override,bool normalize_loops,
          unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *polygon)

{
  __uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_> *p_Var1;
  _Head_base<0UL,_S2Loop_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  pointer psVar5;
  undefined7 in_register_00000081;
  size_type len;
  string_view str_00;
  string_view str_01;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  loops;
  vector<absl::string_view,_std::allocator<absl::string_view>_> loop_strs;
  S2Debug local_81;
  _Head_base<0UL,_S2Loop_*,_false> local_80;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  local_78;
  __uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_> *local_60;
  vector<absl::string_view,_std::allocator<absl::string_view>_> local_58;
  string_view local_40;
  
  psVar5 = (pointer)str.ptr_;
  p_Var1 = (__uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_> *)
           CONCAT71(in_register_00000081,normalize_loops);
  local_81 = (S2Debug)str.length_;
  absl::string_view::string_view(&local_40,"empty");
  local_60 = p_Var1;
  if ((pointer)local_40.length_ == psVar5) {
    if (psVar5 != (pointer)0x0 && (s2textformat *)local_40.ptr_ != this) {
      iVar4 = bcmp(this,local_40.ptr_,(size_t)psVar5);
      if (iVar4 != 0) goto LAB_00229eb4;
    }
    absl::string_view::string_view((string_view *)&local_58,"");
    this = (s2textformat *)
           local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
           _M_impl.super__Vector_impl_data._M_start;
    psVar5 = local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
LAB_00229eb4:
  str_01.length_ = 0x3b;
  str_01.ptr_ = (char *)psVar5;
  SplitString(&local_58,this,str_01,normalize_loops);
  local_78.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar5 = local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_80._M_head_impl = (S2Loop *)0x0;
      str_00.length_ = (size_type)&local_80;
      str_00.ptr_ = (char *)psVar5->length_;
      bVar3 = MakeLoop((s2textformat *)psVar5->ptr_,str_00,
                       (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)
                       (ulong)((uint)str.length_ & 0xff),normalize_loops);
      _Var2._M_head_impl = local_80._M_head_impl;
      if (!bVar3) {
        if ((pointer)local_80._M_head_impl != (pointer)0x0) {
          S2Loop::~S2Loop(local_80._M_head_impl);
          operator_delete(_Var2._M_head_impl);
        }
        bVar3 = false;
        goto LAB_00229fc7;
      }
      if ((debug_override != ALLOW) &&
         (((local_80._M_head_impl)->num_vertices_ != 1 ||
          (((local_80._M_head_impl)->origin_inside_ & 1U) == 0)))) {
        S2Loop::Normalize(local_80._M_head_impl);
      }
      std::
      vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
      ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
                ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                  *)&local_78,(unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)&local_80);
      _Var2._M_head_impl = local_80._M_head_impl;
      if ((pointer)local_80._M_head_impl != (pointer)0x0) {
        S2Loop::~S2Loop(local_80._M_head_impl);
        operator_delete(_Var2._M_head_impl);
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != local_58.
                       super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  absl::
  make_unique<S2Polygon,std::vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>,S2Debug&>
            ((absl *)&local_80,&local_78,&local_81);
  _Var2._M_head_impl = local_80._M_head_impl;
  local_80._M_head_impl = (S2Loop *)0x0;
  std::__uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>::reset
            (local_60,(pointer)_Var2._M_head_impl);
  _Var2._M_head_impl = local_80._M_head_impl;
  if ((S2Polygon *)local_80._M_head_impl != (S2Polygon *)0x0) {
    S2Polygon::~S2Polygon((S2Polygon *)local_80._M_head_impl);
    operator_delete(_Var2._M_head_impl);
  }
  bVar3 = true;
LAB_00229fc7:
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::~vector(&local_78);
  if (local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

static bool InternalMakePolygon(string_view str,
                                S2Debug debug_override,
                                bool normalize_loops,
                                unique_ptr<S2Polygon>* polygon) {
  if (str == "empty") str = "";
  vector<string_view> loop_strs = SplitString(str, ';');
  vector<unique_ptr<S2Loop>> loops;
  for (const auto& loop_str : loop_strs) {
    std::unique_ptr<S2Loop> loop;
    if (!MakeLoop(loop_str, &loop, debug_override)) return false;
    // Don't normalize loops that were explicitly specified as "full".
    if (normalize_loops && !loop->is_full()) loop->Normalize();
    loops.push_back(std::move(loop));
  }
  *polygon = make_unique<S2Polygon>(std::move(loops), debug_override);
  return true;
}